

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testfunc.cpp
# Opt level: O1

void __thiscall trun::TestFunc::PrintTestResult(TestFunc *this)

{
  double dVar1;
  kTestResult kVar2;
  uint uVar3;
  TestResult *this_00;
  element_type *peVar4;
  long lVar5;
  string *psVar6;
  pointer pcVar7;
  
  this_00 = (this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  dVar1 = this_00->tElapsedSec;
  kVar2 = this_00->testResult;
  if (kVar2 == kTestResult_Pass) {
    uVar3 = this_00->numError;
    if ((uVar3 == 0) &&
       ((this_00->assertError).assertErrors.
        super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (this_00->assertError).assertErrors.
        super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
        ._M_impl.super__Vector_impl_data._M_start)) {
      printf("=== PASS:\t%s, %.3f sec, %d\n",(this_00->symbolName)._M_dataplus._M_p);
      goto LAB_0010ea4e;
    }
    lVar5 = (long)(this_00->assertError).assertErrors.
                  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this_00->assertError).assertErrors.
                  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    pcVar7 = (this_00->symbolName)._M_dataplus._M_p;
  }
  else {
    if (kVar2 == kTestResult_InvalidReturnCode) {
      printf("=== INVALID RETURN CODE (%d) for %s",5,(this_00->symbolName)._M_dataplus._M_p);
      goto LAB_0010ea4e;
    }
    pcVar7 = (this_00->symbolName)._M_dataplus._M_p;
    if (this_00->failState != Main) {
      psVar6 = TestResult::FailStateName_abi_cxx11_(this_00);
      peVar4 = (this->testResult).super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      printf("=== FAIL:\t%s (%s), %.3f sec, %d, %d, %zu\n",dVar1,pcVar7,(psVar6->_M_dataplus)._M_p,
             (ulong)peVar4->testResult,(ulong)(uint)peVar4->numError,
             ((long)*(pointer *)
                     ((long)&(peVar4->assertError).assertErrors.
                             super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              (long)(peVar4->assertError).assertErrors.
                    super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7);
      goto LAB_0010ea4e;
    }
    lVar5 = (long)(this_00->assertError).assertErrors.
                  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this_00->assertError).assertErrors.
                  super__Vector_base<trun::AssertError::AssertErrorItem,_std::allocator<trun::AssertError::AssertErrorItem>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = this_00->numError;
  }
  printf("=== FAIL:\t%s, %.3f sec, %d, %d, %zu\n",pcVar7,(ulong)kVar2,(ulong)uVar3,
         (lVar5 >> 3) * -0x71c71c71c71c71c7);
LAB_0010ea4e:
  putchar(10);
  return;
}

Assistant:

void TestFunc::PrintTestResult() {
    double tElapsedSec = testResult->ElapsedTimeSec();
    if (testResult->Result() != kTestResult_Pass) {
        if (testResult->Result() == kTestResult_InvalidReturnCode) {

            printf("=== INVALID RETURN CODE (%d) for %s", testResult->Result(), testResult->SymbolName().c_str());
        } else {
            //std::string failState = testResult->FailState() == TestResult::kFailState::PreHook?"pre-hook"
            if (testResult->FailState() == TestResult::kFailState::Main) {
                printf("=== FAIL:\t%s, %.3f sec, %d, %d, %zu\n", testResult->SymbolName().c_str(), tElapsedSec,
                       testResult->Result(), testResult->Errors(), testResult->Asserts());
            } else {
                printf("=== FAIL:\t%s (%s), %.3f sec, %d, %d, %zu\n",
                       testResult->SymbolName().c_str(),
                       testResult->FailStateName().c_str(),
                       tElapsedSec,
                       testResult->Result(), testResult->Errors(), testResult->Asserts());
            }
        }
    } else {
        if ((testResult->Errors() != 0) || (testResult->Asserts() != 0)) {
            printf("=== FAIL:\t%s, %.3f sec, %d, %d, %zu\n",testResult->SymbolName().c_str(), tElapsedSec, testResult->Result(), testResult->Errors(), testResult->Asserts());
        } else {
            printf("=== PASS:\t%s, %.3f sec, %d\n",testResult->SymbolName().c_str(),tElapsedSec, testResult->Result());
        }
    }
    printf("\n");
}